

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O0

int archive_read_format_raw_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long local_40;
  ssize_t avail;
  raw_info *info;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  avail = (ssize_t)a->format->data;
  info = (raw_info *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (*(long *)(avail + 8) != 0) {
    __archive_read_consume(a,*(int64_t *)(avail + 8));
    *(undefined8 *)(avail + 8) = 0;
  }
  if (*(int *)(avail + 0x10) == 0) {
    pvVar1 = __archive_read_ahead((archive_read *)buff_local,1,&local_40);
    *size_local = (size_t)pvVar1;
    if (local_40 < 1) {
      if (local_40 == 0) {
        *(undefined4 *)(avail + 0x10) = 1;
        *offset_local = 0;
        info->offset = *(int64_t *)avail;
        a_local._4_4_ = 1;
      }
      else {
        *offset_local = 0;
        info->offset = *(int64_t *)avail;
        a_local._4_4_ = (int)local_40;
      }
    }
    else {
      *offset_local = local_40;
      info->offset = *(int64_t *)avail;
      *(int64_t *)avail = *offset_local + *(long *)avail;
      *(long *)(avail + 8) = local_40;
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_raw_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct raw_info *info;
	ssize_t avail;

	info = (struct raw_info *)(a->format->data);

	/* Consume the bytes we read last time. */
	if (info->unconsumed) {
		__archive_read_consume(a, info->unconsumed);
		info->unconsumed = 0;
	}

	if (info->end_of_file)
		return (ARCHIVE_EOF);

	/* Get whatever bytes are immediately available. */
	*buff = __archive_read_ahead(a, 1, &avail);
	if (avail > 0) {
		/* Return the bytes we just read */
		*size = avail;
		*offset = info->offset;
		info->offset += *size;
		info->unconsumed = avail;
		return (ARCHIVE_OK);
	} else if (0 == avail) {
		/* Record and return end-of-file. */
		info->end_of_file = 1;
		*size = 0;
		*offset = info->offset;
		return (ARCHIVE_EOF);
	} else {
		/* Record and return an error. */
		*size = 0;
		*offset = info->offset;
		return ((int)avail);
	}
}